

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::DrawXFB::prepare(DrawXFB *this,GLenum capture_mode)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  undefined4 *puVar7;
  uint local_24;
  GLuint i;
  Functions *gl;
  GLenum capture_mode_local;
  DrawXFB *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader_xfb,
                     s_fragment_shader,s_xfb_varyings,2,capture_mode,false,(GLint *)0x0);
  this->m_program_id_xfb = GVar2;
  if (this->m_program_id_xfb == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader_draw,
                     s_fragment_shader,(GLchar **)0x0,0,capture_mode,false,(GLint *)0x0);
  this->m_program_id_draw = GVar2;
  if (this->m_program_id_draw == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->genTransformFeedbacks)(3,this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x111f);
  (*gl_00->genBuffers)(3,this->m_bo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1123);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    (*gl_00->bindBuffer)(0x8c8e,this->m_bo_id[local_24]);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1128);
    (*gl_00->bufferData)(0x8c8e,0xc0,(void *)0x0,0x88ea);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x112b);
  }
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glClearColor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1130);
  (*gl_00->genFramebuffers)(1,&this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1133);
  (*gl_00->genRenderbuffers)(1,&this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1136);
  (*gl_00->bindFramebuffer)(0x8d40,this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1139);
  (*gl_00->bindRenderbuffer)(0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x113c);
  (*gl_00->renderbufferStorage)(0x8d41,0x8058,2,2);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glRenderbufferStorage call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x113f);
  (*gl_00->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glFramebufferRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1142);
  GVar3 = (*gl_00->checkFramebufferStatus)(0x8d40);
  if (GVar3 != 0x8cd5) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->viewport)(0,0,2,2);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x114a);
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x114e);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFB::prepare(glw::GLenum capture_mode)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id_xfb = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_xfb, s_fragment_shader,
		s_xfb_varyings, s_xfb_varyings_count, capture_mode);

	if (0 == m_program_id_xfb)
	{
		throw 0;
	}

	m_program_id_draw = gl3cts::TransformFeedback::Utilities::buildProgram(gl, m_context.getTestContext().getLog(),
																		   NULL, NULL, NULL, s_vertex_shader_draw,
																		   s_fragment_shader, NULL, 0, capture_mode);

	if (0 == m_program_id_draw)
	{
		throw 0;
	}

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(s_xfb_count, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_xfb_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	for (glw::GLuint i = 0; i < s_xfb_count; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_capture_size, NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");
	}

	/* Prepare framebuffer. */
	gl.clearColor(0.f, 0.f, 0.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genRenderbuffers(1, &m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage call failed.");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");
}